

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

CharConv * CharConv::conv_for_type(CVmPackType *t)

{
  CVmPackType *t_local;
  CharConv *local_8;
  
  switch(t->type_code) {
  case L'A':
  case L'a':
    local_8 = &s_CharConvLatin1.super_CharConv;
    break;
  default:
    local_8 = (CharConv *)0x0;
    break;
  case L'H':
    local_8 = (CharConv *)&s_CharConvHexB;
    break;
  case L'U':
  case L'u':
    local_8 = &s_CharConvUTF8.super_CharConv;
    break;
  case L'W':
  case L'w':
    if (t->big_endian == 0) {
      local_8 = (CharConv *)&s_CharConvUCS2L;
    }
    else {
      local_8 = (CharConv *)&s_CharConvUCS2B;
    }
    break;
  case L'b':
    local_8 = &s_CharConvByte.super_CharConv;
    break;
  case L'h':
    local_8 = (CharConv *)&s_CharConvHexL;
  }
  return local_8;
}

Assistant:

CharConv *CharConv::conv_for_type(const CVmPackType *t)
{
    switch (t->type_code)
    {
    case 'a':
    case 'A':
        return &s_CharConvLatin1;

    case 'b':
        return &s_CharConvByte;

    case 'u':
    case 'U':
        return &s_CharConvUTF8;

    case 'w':
    case 'W':
        if (t->big_endian)
            return &s_CharConvUCS2B;
        else
            return &s_CharConvUCS2L;

    case 'h':
        return &s_CharConvHexL;

    case 'H':
        return &s_CharConvHexB;

    default:
        /* it's not a string type */
        return 0;
    }
}